

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Vector.cpp
# Opt level: O0

LE_Vector<KDIS::DATA_TYPE::KFIXED<char,_(unsigned_char)__x03_>_> * __thiscall
KDIS::DATA_TYPE::LE_Vector<KDIS::DATA_TYPE::KFIXED<char,_(unsigned_char)'\x03'>_>::operator*
          (LE_Vector<KDIS::DATA_TYPE::KFIXED<char,_(unsigned_char)__x03_>_> *__return_storage_ptr__,
          LE_Vector<KDIS::DATA_TYPE::KFIXED<char,_(unsigned_char)__x03_>_> *this,KFLOAT64 Value)

{
  KFIXED<char,_(unsigned_char)__x03_> local_98;
  KFIXED<char,_(unsigned_char)__x03_> local_88;
  KFIXED<char,_(unsigned_char)__x03_> local_78;
  KFIXED<char,_(unsigned_char)__x03_> local_68 [2];
  KFIXED<char,_(unsigned_char)__x03_> local_48;
  KFIXED<char,_(unsigned_char)__x03_> local_38;
  undefined1 local_21;
  KFLOAT64 local_20;
  KFLOAT64 Value_local;
  LE_Vector<KDIS::DATA_TYPE::KFIXED<char,_(unsigned_char)__x03_>_> *this_local;
  LE_Vector<KDIS::DATA_TYPE::KFIXED<char,_(unsigned_char)__x03_>_> *tmp;
  
  local_21 = 0;
  local_20 = Value;
  Value_local = (KFLOAT64)this;
  this_local = __return_storage_ptr__;
  LE_Vector(__return_storage_ptr__,this);
  KFIXED<char,_(unsigned_char)'\x03'>::operator*(&local_48,local_20);
  KFIXED<char,_(unsigned_char)'\x03'>::operator=(&local_38,&__return_storage_ptr__->m_X);
  KFIXED<char,_(unsigned_char)'\x03'>::~KFIXED(&local_38);
  KFIXED<char,_(unsigned_char)'\x03'>::~KFIXED(&local_48);
  KFIXED<char,_(unsigned_char)'\x03'>::operator*(&local_78,local_20);
  KFIXED<char,_(unsigned_char)'\x03'>::operator=(local_68,&__return_storage_ptr__->m_Y);
  KFIXED<char,_(unsigned_char)'\x03'>::~KFIXED(local_68);
  KFIXED<char,_(unsigned_char)'\x03'>::~KFIXED(&local_78);
  KFIXED<char,_(unsigned_char)'\x03'>::operator*(&local_98,local_20);
  KFIXED<char,_(unsigned_char)'\x03'>::operator=(&local_88,&__return_storage_ptr__->m_Z);
  KFIXED<char,_(unsigned_char)'\x03'>::~KFIXED(&local_88);
  KFIXED<char,_(unsigned_char)'\x03'>::~KFIXED(&local_98);
  return __return_storage_ptr__;
}

Assistant:

LE_Vector<Type> LE_Vector<Type>::operator * ( KFLOAT64 Value ) const
{
    LE_Vector tmp = *this;
    tmp.m_X = tmp.m_X * Value;
    tmp.m_Y = tmp.m_Y * Value;
    tmp.m_Z = tmp.m_Z * Value;
    return tmp;
}